

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

bool __thiscall nv::Image::load(Image *this,char *name)

{
  bool bVar1;
  Image *pIVar2;
  AutoPtr<nv::Image> local_28;
  AutoPtr<nv::Image> img;
  char *name_local;
  Image *this_local;
  
  img.m_ptr = (Image *)name;
  free(this,name);
  pIVar2 = ImageIO::load(img.m_ptr);
  AutoPtr<nv::Image>::AutoPtr(&local_28,pIVar2);
  bVar1 = nv::operator==(&local_28,(Image *)0x0);
  if (!bVar1) {
    pIVar2 = AutoPtr<nv::Image>::operator->(&local_28);
    swap<unsigned_int>(&this->m_width,&pIVar2->m_width);
    pIVar2 = AutoPtr<nv::Image>::operator->(&local_28);
    swap<unsigned_int>(&this->m_height,&pIVar2->m_height);
    pIVar2 = AutoPtr<nv::Image>::operator->(&local_28);
    swap<nv::Image::Format>(&this->m_format,&pIVar2->m_format);
    pIVar2 = AutoPtr<nv::Image>::operator->(&local_28);
    swap<nv::Color32*>(&this->m_data,&pIVar2->m_data);
  }
  this_local._7_1_ = !bVar1;
  AutoPtr<nv::Image>::~AutoPtr(&local_28);
  return this_local._7_1_;
}

Assistant:

bool Image::load(const char * name)
{
	free();
	
	AutoPtr<Image> img(ImageIO::load(name));
	if (img == NULL) {
		return false;
	}
	
	swap(m_width, img->m_width);
	swap(m_height, img->m_height);
	swap(m_format, img->m_format);
	swap(m_data, img->m_data);
	
	return true;
}